

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

int R_FindCustomTranslation(FName *name)

{
  Node *pNVar1;
  uint uVar2;
  Node *pNVar3;
  
  uVar2 = name->Index;
  if ((long)(int)uVar2 < 0x29b) {
    if (uVar2 - 0x293 < 8) {
      uVar2 = uVar2 - 0x293 | 0x90000;
    }
    else if (uVar2 != 0) {
      if (uVar2 == 0x33) {
        return 0x30007;
      }
      goto LAB_00334a91;
    }
  }
  else {
    if (7 < uVar2 - 0x29b) {
LAB_00334a91:
      uVar2 = FName::NameManager::FindName
                        (&FName::NameData,FName::NameData.NameArray[(int)uVar2].Text,true);
      pNVar1 = customTranslationMap.Nodes + (customTranslationMap.Size - 1 & uVar2);
      while( true ) {
        pNVar3 = pNVar1;
        if (pNVar3 == (Node *)0x0) {
          return -1;
        }
        if (pNVar3->Next == (Node *)0x1) break;
        pNVar1 = pNVar3->Next;
        if ((pNVar3->Pair).Key.Index == uVar2) {
          return (pNVar3->Pair).Value;
        }
      }
      return -1;
    }
    uVar2 = uVar2 - 0x29b | 0x10000;
  }
  return uVar2;
}

Assistant:

operator int() const { return Index; }